

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::anon_unknown_35::InMemoryFile::stat(InMemoryFile *this,char *__file,stat *__buf)

{
  uint64_t size;
  uint64_t spaceUsed;
  Impl *pIVar1;
  uint64_t hash;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  InMemoryFile *this_local;
  
  lock.ptr = (Impl *)__file;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&hash);
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&hash);
  size = pIVar1->size;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&hash);
  spaceUsed = pIVar1->size;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&hash);
  FsNode::Metadata::Metadata
            ((Metadata *)this,FILE,size,spaceUsed,(Date)(pIVar1->lastModified).value.value,1,
             (uint64_t)__file);
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&hash);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::FILE, lock->size, lock->size, lock->lastModified, 1, hash };
  }